

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O2

int xmlValidateAttributeValue2
              (xmlValidCtxtPtr ctxt,xmlDocPtr doc,xmlChar *name,xmlAttributeType type,xmlChar *value
              )

{
  xmlEntityPtr pxVar1;
  byte *pbVar2;
  xmlNotationPtr pxVar3;
  char *pcVar4;
  xmlParserErrors xVar5;
  byte bVar6;
  byte *name_00;
  byte *pbVar7;
  int local_4c;
  
  if (type == XML_ATTRIBUTE_NOTATION) {
    pxVar3 = xmlGetDtdNotationDesc(doc->intSubset,value);
    if (pxVar3 != (xmlNotationPtr)0x0) {
      return 1;
    }
    if ((doc->extSubset != (xmlDtdPtr)0x0) &&
       (pxVar3 = xmlGetDtdNotationDesc(doc->extSubset,value), pxVar3 != (xmlNotationPtr)0x0)) {
      return 1;
    }
    pcVar4 = "NOTATION attribute %s reference an unknown notation \"%s\"\n";
    xVar5 = XML_DTD_UNKNOWN_NOTATION;
    goto LAB_001915f7;
  }
  if (type == XML_ATTRIBUTE_ENTITIES) {
    pbVar2 = xmlStrdup(value);
    if (pbVar2 == (byte *)0x0) {
      return 0;
    }
    bVar6 = *pbVar2;
    local_4c = 1;
    name_00 = pbVar2;
    while (pbVar7 = name_00, bVar6 != 0) {
      while ((0x20 < bVar6 || ((0x100002601U >> ((ulong)bVar6 & 0x3f) & 1) == 0))) {
        bVar6 = pbVar7[1];
        pbVar7 = pbVar7 + 1;
      }
      *pbVar7 = 0;
      pxVar1 = xmlGetDocEntity(doc,name_00);
      if (pxVar1 == (xmlEntityPtr)0x0) {
        xVar5 = XML_DTD_UNKNOWN_ENTITY;
        pcVar4 = "ENTITIES attribute %s reference an unknown entity \"%s\"\n";
LAB_00191525:
        xmlErrValidNode(ctxt,(xmlNodePtr)doc,xVar5,pcVar4,name,name_00,(xmlChar *)0x0);
        local_4c = 0;
      }
      else if (pxVar1->etype != XML_EXTERNAL_GENERAL_UNPARSED_ENTITY) {
        xVar5 = XML_DTD_ENTITY_TYPE;
        pcVar4 = "ENTITIES attribute %s reference an entity \"%s\" of wrong type\n";
        goto LAB_00191525;
      }
      if (bVar6 == 0) break;
      *pbVar7 = bVar6;
      while ((name_00 = pbVar7, bVar6 < 0x21 && ((0x100002600U >> ((ulong)bVar6 & 0x3f) & 1) != 0)))
      {
        bVar6 = pbVar7[1];
        pbVar7 = pbVar7 + 1;
      }
    }
    (*xmlFree)(pbVar2);
    return local_4c;
  }
  if (type != XML_ATTRIBUTE_ENTITY) {
    return 1;
  }
  pxVar1 = xmlGetDocEntity(doc,value);
  if (pxVar1 == (xmlEntityPtr)0x0) {
    if (doc->standalone == 1) {
      doc->standalone = 0;
      pxVar1 = xmlGetDocEntity(doc,value);
      if (pxVar1 != (xmlEntityPtr)0x0) goto LAB_00191458;
    }
    pcVar4 = "ENTITY attribute %s reference an unknown entity \"%s\"\n";
    xVar5 = XML_DTD_UNKNOWN_ENTITY;
  }
  else {
LAB_00191458:
    if (pxVar1->etype == XML_EXTERNAL_GENERAL_UNPARSED_ENTITY) {
      return 1;
    }
    pcVar4 = "ENTITY attribute %s reference an entity \"%s\" of wrong type\n";
    xVar5 = XML_DTD_ENTITY_TYPE;
  }
LAB_001915f7:
  xmlErrValidNode(ctxt,(xmlNodePtr)doc,xVar5,pcVar4,name,value,(xmlChar *)0x0);
  return 0;
}

Assistant:

static int
xmlValidateAttributeValue2(xmlValidCtxtPtr ctxt, xmlDocPtr doc,
      const xmlChar *name, xmlAttributeType type, const xmlChar *value) {
    int ret = 1;
    switch (type) {
	case XML_ATTRIBUTE_IDREFS:
	case XML_ATTRIBUTE_IDREF:
	case XML_ATTRIBUTE_ID:
	case XML_ATTRIBUTE_NMTOKENS:
	case XML_ATTRIBUTE_ENUMERATION:
	case XML_ATTRIBUTE_NMTOKEN:
        case XML_ATTRIBUTE_CDATA:
	    break;
	case XML_ATTRIBUTE_ENTITY: {
	    xmlEntityPtr ent;

	    ent = xmlGetDocEntity(doc, value);
	    /* yeah it's a bit messy... */
	    if ((ent == NULL) && (doc->standalone == 1)) {
		doc->standalone = 0;
		ent = xmlGetDocEntity(doc, value);
	    }
	    if (ent == NULL) {
		xmlErrValidNode(ctxt, (xmlNodePtr) doc,
				XML_DTD_UNKNOWN_ENTITY,
   "ENTITY attribute %s reference an unknown entity \"%s\"\n",
		       name, value, NULL);
		ret = 0;
	    } else if (ent->etype != XML_EXTERNAL_GENERAL_UNPARSED_ENTITY) {
		xmlErrValidNode(ctxt, (xmlNodePtr) doc,
				XML_DTD_ENTITY_TYPE,
   "ENTITY attribute %s reference an entity \"%s\" of wrong type\n",
		       name, value, NULL);
		ret = 0;
	    }
	    break;
        }
	case XML_ATTRIBUTE_ENTITIES: {
	    xmlChar *dup, *nam = NULL, *cur, save;
	    xmlEntityPtr ent;

	    dup = xmlStrdup(value);
	    if (dup == NULL)
		return(0);
	    cur = dup;
	    while (*cur != 0) {
		nam = cur;
		while ((*cur != 0) && (!IS_BLANK_CH(*cur))) cur++;
		save = *cur;
		*cur = 0;
		ent = xmlGetDocEntity(doc, nam);
		if (ent == NULL) {
		    xmlErrValidNode(ctxt, (xmlNodePtr) doc,
				    XML_DTD_UNKNOWN_ENTITY,
       "ENTITIES attribute %s reference an unknown entity \"%s\"\n",
			   name, nam, NULL);
		    ret = 0;
		} else if (ent->etype != XML_EXTERNAL_GENERAL_UNPARSED_ENTITY) {
		    xmlErrValidNode(ctxt, (xmlNodePtr) doc,
				    XML_DTD_ENTITY_TYPE,
       "ENTITIES attribute %s reference an entity \"%s\" of wrong type\n",
			   name, nam, NULL);
		    ret = 0;
		}
		if (save == 0)
		    break;
		*cur = save;
		while (IS_BLANK_CH(*cur)) cur++;
	    }
	    xmlFree(dup);
	    break;
	}
	case XML_ATTRIBUTE_NOTATION: {
	    xmlNotationPtr nota;

	    nota = xmlGetDtdNotationDesc(doc->intSubset, value);
	    if ((nota == NULL) && (doc->extSubset != NULL))
		nota = xmlGetDtdNotationDesc(doc->extSubset, value);

	    if (nota == NULL) {
		xmlErrValidNode(ctxt, (xmlNodePtr) doc,
		                XML_DTD_UNKNOWN_NOTATION,
       "NOTATION attribute %s reference an unknown notation \"%s\"\n",
		       name, value, NULL);
		ret = 0;
	    }
	    break;
        }
    }
    return(ret);
}